

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

CryptoUtil * __thiscall
cfd::core::CryptoUtil::EncodeBase58Check_abi_cxx11_(CryptoUtil *this,ByteData *data)

{
  uchar *bytes;
  size_type bytes_len;
  CfdException *this_00;
  char *wally_string;
  allocator local_89;
  string local_88;
  CfdSourceLocation local_68;
  int local_3c;
  WallyUtil *pWStack_38;
  int ret;
  char *output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  ByteData *data_local;
  
  byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,data);
  pWStack_38 = (WallyUtil *)0x0;
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output);
  local_3c = wally_base58_from_bytes(bytes,bytes_len,1,(char **)&stack0xffffffffffffffc8);
  if (local_3c != 0) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x40e;
    local_68.funcname = "EncodeBase58Check";
    logger::warn<int&>(&local_68,"wally_base58_from_bytes NG[{}].",&local_3c);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_88,"Decode base58 error.",&local_89);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_88);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)this,pWStack_38,wally_string);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output);
  return this;
}

Assistant:

std::string CryptoUtil::EncodeBase58Check(const ByteData &data) {
  std::vector<uint8_t> byte_array = data.GetBytes();
  char *output = nullptr;

  int ret = wally_base58_from_bytes(
      byte_array.data(), byte_array.size(), BASE58_FLAG_CHECKSUM, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "Decode base58 error.");
  }
  return WallyUtil::ConvertStringAndFree(output);
}